

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::RenderHeatmap<int,ImPlot::TransformerLogLog>
               (TransformerLogLog transformer,ImDrawList *DrawList,int *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max,bool reverse_y)

{
  ImPlotContext *pIVar1;
  ImU32 col_00;
  ImPlotScale IVar2;
  double dVar3;
  double v;
  double local_210;
  ImVec2 local_1fc;
  ImVec2 local_1f4;
  ImU32 local_1ec;
  undefined1 auStack_1e8 [4];
  ImU32 col_1;
  ImVec4 color;
  double t;
  ImVec2 size;
  char buff [32];
  ImVec2 px;
  ImPlotPoint p;
  int local_188;
  int c;
  int r;
  int i;
  ImPlotPoint half_size;
  double h;
  double w;
  RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLogLog> local_158;
  TransformerLinLog local_13c;
  RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLinLog> local_138;
  TransformerLogLin local_11c;
  RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLogLin> local_118;
  TransformerLinLin local_fc;
  RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLinLin> local_f8;
  undefined1 local_e0 [8];
  GetterHeatmap<int> getter;
  double ydir;
  double yref;
  ImVec2 IStack_68;
  ImU32 col;
  ImVec2 b;
  ImVec2 a;
  int temp_max;
  int temp_min;
  ImPlotContext *gp;
  bool reverse_y_local;
  char *fmt_local;
  double scale_max_local;
  double scale_min_local;
  int cols_local;
  int rows_local;
  int *values_local;
  ImDrawList *DrawList_local;
  TransformerLogLog transformer_local;
  
  pIVar1 = GImPlot;
  fmt_local = (char *)scale_max;
  scale_max_local = scale_min;
  DrawList_local._4_4_ = transformer.YAxis;
  if ((((scale_min == 0.0) && (!NAN(scale_min))) && (scale_max == 0.0)) && (!NAN(scale_max))) {
    ImMinMaxArray<int>(values,rows * cols,(int *)&a.y,(int *)&a);
    scale_max_local = (double)(int)a.y;
    fmt_local = (char *)(double)(int)a.x;
  }
  if ((scale_max_local != (double)fmt_local) || (NAN(scale_max_local) || NAN((double)fmt_local))) {
    if (reverse_y) {
      local_210 = bounds_max->y;
    }
    else {
      local_210 = bounds_min->y;
    }
    getter.HalfSize.y = (double)(int)(-(reverse_y & 1) | 1);
    GetterHeatmap<int>::GetterHeatmap
              ((GetterHeatmap<int> *)local_e0,values,rows,cols,scale_max_local,(double)fmt_local,
               (bounds_max->x - bounds_min->x) / (double)cols,
               (bounds_max->y - bounds_min->y) / (double)rows,bounds_min->x,local_210,
               getter.HalfSize.y);
    IVar2 = GetCurrentScale();
    switch(IVar2) {
    case 0:
      TransformerLinLin::TransformerLinLin(&local_fc);
      RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLinLin>::RectRenderer
                (&local_f8,(GetterHeatmap<int> *)local_e0,&local_fc);
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<int>,ImPlot::TransformerLinLin>>
                (&local_f8,DrawList,&pIVar1->CurrentPlot->PlotRect);
      break;
    case 1:
      TransformerLogLin::TransformerLogLin(&local_11c);
      RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLogLin>::RectRenderer
                (&local_118,(GetterHeatmap<int> *)local_e0,&local_11c);
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<int>,ImPlot::TransformerLogLin>>
                (&local_118,DrawList,&pIVar1->CurrentPlot->PlotRect);
      break;
    case 2:
      TransformerLinLog::TransformerLinLog(&local_13c);
      RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLinLog>::RectRenderer
                (&local_138,(GetterHeatmap<int> *)local_e0,&local_13c);
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<int>,ImPlot::TransformerLinLog>>
                (&local_138,DrawList,&pIVar1->CurrentPlot->PlotRect);
      break;
    case 3:
      TransformerLogLog::TransformerLogLog((TransformerLogLog *)((long)&w + 4));
      RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLogLog>::RectRenderer
                (&local_158,(GetterHeatmap<int> *)local_e0,(TransformerLogLog *)((long)&w + 4));
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<int>,ImPlot::TransformerLogLog>>
                (&local_158,DrawList,&pIVar1->CurrentPlot->PlotRect);
    }
    if (fmt != (char *)0x0) {
      dVar3 = (bounds_max->x - bounds_min->x) / (double)cols;
      half_size.y = (bounds_max->y - bounds_min->y) / (double)rows;
      ImPlotPoint::ImPlotPoint((ImPlotPoint *)&r,dVar3 * 0.5,half_size.y * 0.5);
      c = 0;
      for (local_188 = 0; local_188 < rows; local_188 = local_188 + 1) {
        for (p.y._4_4_ = 0; p.y._4_4_ < cols; p.y._4_4_ = p.y._4_4_ + 1) {
          ImPlotPoint::ImPlotPoint((ImPlotPoint *)&px);
          px = (ImVec2)((double)p.y._4_4_ * dVar3 + dVar3 * 0.5 + bounds_min->x);
          buff._24_8_ = TransformerLogLog::operator()
                                  ((TransformerLogLog *)((long)&DrawList_local + 4),
                                   (ImPlotPoint *)&px);
          sprintf((char *)&size,fmt,(ulong)(uint)values[c]);
          t = (double)ImGui::CalcTextSize((char *)&size,(char *)0x0,false,-1.0);
          v = ImRemap01<double>((double)values[c],scale_max_local,(double)fmt_local);
          color._8_8_ = ImClamp<double>(v,0.0,1.0);
          _auStack_1e8 = SampleColormap((float)(double)color._8_8_,-1);
          local_1ec = CalcTextColor((ImVec4 *)auStack_1e8);
          local_1fc = ::operator*((ImVec2 *)&t,0.5);
          local_1f4 = operator-((ImVec2 *)(buff + 0x18),&local_1fc);
          ImDrawList::AddText(DrawList,&local_1f4,local_1ec,(char *)&size,(char *)0x0);
          c = c + 1;
        }
      }
    }
  }
  else {
    b = TransformerLogLog::operator()((TransformerLogLog *)((long)&DrawList_local + 4),bounds_min);
    IStack_68 = TransformerLogLog::operator()
                          ((TransformerLogLog *)((long)&DrawList_local + 4),bounds_max);
    col_00 = GetColormapColorU32(0,(pIVar1->Style).Colormap);
    ImDrawList::AddRectFilled(DrawList,&b,&stack0xffffffffffffff98,col_00,0.0,0);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max, bool reverse_y) {
    ImPlotContext& gp = *GImPlot;
    if (scale_min == 0 && scale_max == 0) {
        T temp_min, temp_max;
        ImMinMaxArray(values,rows*cols,&temp_min,&temp_max);
        scale_min = (double)temp_min;
        scale_max = (double)temp_max;
    }
    if (scale_min == scale_max) {
        ImVec2 a = transformer(bounds_min);
        ImVec2 b = transformer(bounds_max);
        ImU32  col = GetColormapColorU32(0,gp.Style.Colormap);
        DrawList.AddRectFilled(a, b, col);
        return;
    }
    const double yref = reverse_y ? bounds_max.y : bounds_min.y;
    const double ydir = reverse_y ? -1 : 1;
    GetterHeatmap<T> getter(values, rows, cols, scale_min, scale_max, (bounds_max.x - bounds_min.x) / cols, (bounds_max.y - bounds_min.y) / rows, bounds_min.x, yref, ydir);
    switch (GetCurrentScale()) {
        case ImPlotScale_LinLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLin>(getter, TransformerLinLin()), DrawList, gp.CurrentPlot->PlotRect); break;
        case ImPlotScale_LogLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLin>(getter, TransformerLogLin()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LinLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLog>(getter, TransformerLinLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LogLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLog>(getter, TransformerLogLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
    }
    if (fmt != NULL) {
        const double w = (bounds_max.x - bounds_min.x) / cols;
        const double h = (bounds_max.y - bounds_min.y) / rows;
        const ImPlotPoint half_size(w*0.5,h*0.5);
        int i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = yref + ydir * (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImClamp(ImRemap01((double)values[i], scale_min, scale_max),0.0,1.0);
                ImVec4 color = SampleColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}